

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateCast(ExpressionContext *ctx,SynBase *source,ExprBase *value,TypeBase *type,
          bool isFunctionArgument)

{
  TypeBase *pTVar1;
  VariableData *pVVar2;
  ExprVariableAccess *type_00;
  bool bVar3;
  ExprFunctionDefinition *definition_00;
  ExprBase *pEVar4;
  bool_type bVar5;
  TypeUnsizedArray *pTVar6;
  ExprTypeCast *pEVar7;
  ExprDereference *pEVar8;
  TypeRef *pTVar9;
  VariableHandle *pVVar10;
  VariableData *pVVar11;
  ExprVariableDefinition *pEVar12;
  ExprTypeLiteral *this;
  ExprGetAddress *this_00;
  ExprAssignment *this_01;
  TypeArray *pTVar13;
  undefined8 in_stack_fffffffffffffb38;
  char *pcVar14;
  undefined4 uVar15;
  ExprBase *ptr;
  ExprBase *unsized;
  TypeArray *valueType_2;
  ExprDereference *local_1a0;
  ExprDereference *node_5;
  ExprBase *address_2;
  ExprVariableAccess *node_4;
  ExprTypeCast *typeCast;
  ExprBase *result_2;
  ExprBase *definition_3;
  ExprBase *assignment_2;
  VariableData *storage_2;
  SynBase *sourceInternal_2;
  ExprDereference *node_3;
  ExprBase *address_1;
  ExprVariableAccess *node_2;
  ExprBase *local_130;
  ExprBase *checked;
  ExprBase *typeID;
  ExprBase *untyped;
  TypeClass *valueClass;
  TypeClass *targetClass;
  ExprBase *result_1;
  ExprBase *definition_2;
  ExprBase *assignment_1;
  VariableData *storage_1;
  SynBase *sourceInternal_1;
  TypeArray *sourceSub;
  TypeUnsizedArray *targetSub;
  TypeRef *valueType_1;
  TypeRef *target_2;
  ExprBase *result;
  ExprBase *assignment;
  ExprBase *definition_1;
  ExprBase *alloc;
  VariableData *storage;
  SynBase *sourceInternal;
  ExprDereference *node_1;
  ExprBase *address;
  ExprVariableAccess *node;
  TypeArray *valueType;
  TypeUnsizedArray *target_1;
  ExprBase *access;
  FunctionValue function;
  TypeFunction *target;
  ExprFunctionDefinition *definition;
  bool isFunctionArgument_local;
  TypeBase *type_local;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  uVar15 = (undefined4)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  bVar3 = isType<TypeError>(value->type);
  if (bVar3) {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeCast>(ctx);
    ExprTypeCast::ExprTypeCast((ExprTypeCast *)ctx_local,source,type,value,EXPR_CAST_REINTERPRET);
  }
  else {
    definition_00 = getType<ExprFunctionDefinition>(value);
    if (definition_00 == (ExprFunctionDefinition *)0x0) {
      if (value->type == type) {
        AssertValueExpression(ctx,source,value);
        ctx_local = (ExpressionContext *)value;
      }
      else {
        function.context = (ExprBase *)getType<TypeFunction>(type);
        if ((TypeFunction *)function.context != (TypeFunction *)0x0) {
          GetFunctionForType((FunctionValue *)&access,ctx,source,value,
                             (TypeFunction *)function.context);
          bVar5 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)&access);
          if (bVar5 != 0) {
            bVar3 = isType<TypeAutoRef>((TypeBase *)(function.function)->scope);
            if (bVar3) {
              anon_unknown.dwarf_6f1cc::Stop
                        (ctx,source,"ERROR: can\'t convert dynamic function set to \'%.*s\'",
                         (ulong)(uint)((int)(type->name).end - (int)(type->name).begin),
                         (type->name).begin);
            }
            pTVar6 = (TypeUnsizedArray *)ExpressionContext::get<ExprFunctionAccess>(ctx);
            ExprFunctionAccess::ExprFunctionAccess
                      ((ExprFunctionAccess *)pTVar6,(SynBase *)access,type,
                       (FunctionData *)function.source,(ExprBase *)function.function);
            target_1 = pTVar6;
            bVar3 = isType<ExprFunctionDefinition>(value);
            if ((!bVar3) && (bVar3 = isType<ExprGenericFunctionPrototype>(value), !bVar3)) {
              return (ExprBase *)target_1;
            }
            pEVar4 = CreateSequence(ctx,source,value,(ExprBase *)target_1);
            return pEVar4;
          }
          if ((value->type->isGeneric & 1U) != 0) {
            pcVar14 = (type->name).begin;
            anon_unknown.dwarf_6f1cc::Stop
                      (ctx,source,
                       "ERROR: can\'t resolve generic type \'%.*s\' instance for \'%.*s\'",
                       (ulong)(uint)((int)(value->type->name).end - (int)(value->type->name).begin),
                       (value->type->name).begin,
                       (ulong)(uint)((int)(type->name).end - (int)(type->name).begin),pcVar14);
            uVar15 = (undefined4)((ulong)pcVar14 >> 0x20);
          }
        }
        bVar3 = AssertValueExpression(ctx,source,value);
        if (bVar3) {
          bVar3 = ExpressionContext::IsNumericType(ctx,value->type);
          if ((bVar3) && (bVar3 = ExpressionContext::IsNumericType(ctx,type), bVar3)) {
            ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeCast>(ctx);
            ExprTypeCast::ExprTypeCast
                      ((ExprTypeCast *)ctx_local,source,type,value,EXPR_CAST_NUMERICAL);
          }
          else {
            if (type == ctx->typeBool) {
              bVar3 = isType<TypeRef>(value->type);
              if (bVar3) {
                pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_PTR_TO_BOOL);
                return &pEVar7->super_ExprBase;
              }
              bVar3 = isType<TypeUnsizedArray>(value->type);
              if (bVar3) {
                pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_UNSIZED_TO_BOOL);
                return &pEVar7->super_ExprBase;
              }
              bVar3 = isType<TypeFunction>(value->type);
              if (bVar3) {
                pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_FUNCTION_TO_BOOL);
                return &pEVar7->super_ExprBase;
              }
            }
            if (value->type == ctx->typeNullPtr) {
              bVar3 = isType<TypeRef>(type);
              if (bVar3) {
                pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_NULL_TO_PTR);
                return &pEVar7->super_ExprBase;
              }
              if ((TypeStruct *)type == ctx->typeAutoRef) {
                pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_NULL_TO_AUTO_PTR);
                return &pEVar7->super_ExprBase;
              }
              bVar3 = isType<TypeUnsizedArray>(type);
              if (bVar3) {
                pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_NULL_TO_UNSIZED);
                return &pEVar7->super_ExprBase;
              }
              if ((TypeStruct *)type == ctx->typeAutoArray) {
                pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_NULL_TO_AUTO_ARRAY);
                return &pEVar7->super_ExprBase;
              }
              bVar3 = isType<TypeFunction>(type);
              if (bVar3) {
                pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_NULL_TO_FUNCTION);
                return &pEVar7->super_ExprBase;
              }
            }
            valueType = (TypeArray *)getType<TypeUnsizedArray>(type);
            if ((((TypeUnsizedArray *)valueType == (TypeUnsizedArray *)0x0) ||
                (node = (ExprVariableAccess *)getType<TypeArray>(value->type),
                (TypeArray *)node == (TypeArray *)0x0)) ||
               ((TypeBase *)valueType[1].super_TypeBase.name.end != ((TypeArray *)node)->subType)) {
              valueType_1 = getType<TypeRef>(type);
              if (valueType_1 != (TypeRef *)0x0) {
                targetSub = (TypeUnsizedArray *)getType<TypeRef>(value->type);
                if (targetSub == (TypeUnsizedArray *)0x0) {
                  if ((TypeStruct *)value->type == ctx->typeAutoRef) {
                    pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                    ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_AUTO_PTR_TO_PTR);
                    return &pEVar7->super_ExprBase;
                  }
                  if ((isFunctionArgument) && (value->type == valueType_1->subType)) {
                    address_1 = &getType<ExprVariableAccess>(value)->super_ExprBase;
                    if ((ExprVariableAccess *)address_1 != (ExprVariableAccess *)0x0) {
                      this_00 = ExpressionContext::get<ExprGetAddress>(ctx);
                      pTVar9 = ExpressionContext::GetReferenceType(ctx,value->type);
                      pVVar10 = ExpressionContext::get<VariableHandle>(ctx);
                      VariableHandle::VariableHandle
                                (pVVar10,address_1->source,
                                 (VariableData *)address_1[1]._vptr_ExprBase);
                      ExprGetAddress::ExprGetAddress(this_00,source,&pTVar9->super_TypeBase,pVVar10)
                      ;
                      return &this_00->super_ExprBase;
                    }
                    sourceInternal_2 = (SynBase *)getType<ExprDereference>(value);
                    if (sourceInternal_2 != (SynBase *)0x0) {
                      return (ExprBase *)sourceInternal_2->next;
                    }
                    if (valueType_1->subType == value->type) {
                      storage_2 = (VariableData *)ExpressionContext::MakeInternal(ctx,source);
                      assignment_2 = (ExprBase *)
                                     anon_unknown.dwarf_6f1cc::AllocateTemporary
                                               (ctx,(SynBase *)storage_2,valueType_1->subType);
                      this_01 = ExpressionContext::get<ExprAssignment>(ctx);
                      pVVar11 = storage_2;
                      pTVar1 = (TypeBase *)assignment_2->next;
                      pEVar4 = CreateVariableAccess
                                         (ctx,(SynBase *)storage_2,(VariableData *)assignment_2,
                                          false);
                      pEVar4 = CreateGetAddress(ctx,(SynBase *)pVVar11,pEVar4);
                      ExprAssignment::ExprAssignment(this_01,(SynBase *)pVVar11,pTVar1,pEVar4,value)
                      ;
                      definition_3 = &this_01->super_ExprBase;
                      pEVar12 = ExpressionContext::get<ExprVariableDefinition>(ctx);
                      pVVar11 = storage_2;
                      pTVar1 = ctx->typeVoid;
                      pVVar10 = ExpressionContext::get<VariableHandle>(ctx);
                      VariableHandle::VariableHandle
                                (pVVar10,(SynBase *)0x0,(VariableData *)assignment_2);
                      ExprVariableDefinition::ExprVariableDefinition
                                (pEVar12,(SynBase *)pVVar11,pTVar1,pVVar10,definition_3);
                      pVVar11 = storage_2;
                      result_2 = &pEVar12->super_ExprBase;
                      pEVar4 = CreateVariableAccess
                                         (ctx,(SynBase *)storage_2,(VariableData *)assignment_2,
                                          false);
                      typeCast = (ExprTypeCast *)CreateGetAddress(ctx,(SynBase *)pVVar11,pEVar4);
                      pEVar4 = CreateSequence(ctx,source,result_2,(ExprBase *)typeCast);
                      return pEVar4;
                    }
                    sourceInternal_2 = (SynBase *)0x0;
                  }
                }
                else {
                  bVar3 = isType<TypeUnsizedArray>(valueType_1->subType);
                  if ((bVar3) &&
                     (bVar3 = isType<TypeArray>((TypeBase *)(targetSub->super_TypeStruct).typeScope)
                     , bVar3)) {
                    sourceSub = (TypeArray *)getType<TypeUnsizedArray>(valueType_1->subType);
                    sourceInternal_1 =
                         (SynBase *)
                         getType<TypeArray>((TypeBase *)(targetSub->super_TypeStruct).typeScope);
                    if ((TypeBase *)sourceSub[1].super_TypeBase.name.end ==
                        ((TypeArray *)sourceInternal_1)->subType) {
                      storage_1 = (VariableData *)ExpressionContext::MakeInternal(ctx,source);
                      assignment_1 = (ExprBase *)
                                     anon_unknown.dwarf_6f1cc::AllocateTemporary
                                               (ctx,(SynBase *)storage_1,&sourceSub->super_TypeBase)
                      ;
                      pVVar11 = storage_1;
                      pEVar4 = CreateVariableAccess
                                         (ctx,(SynBase *)storage_1,(VariableData *)assignment_1,
                                          false);
                      pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                      ExprTypeCast::ExprTypeCast
                                (pEVar7,(SynBase *)storage_1,&sourceSub->super_TypeBase,value,
                                 EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
                      definition_2 = CreateAssignment(ctx,(SynBase *)pVVar11,pEVar4,
                                                      &pEVar7->super_ExprBase);
                      pEVar12 = ExpressionContext::get<ExprVariableDefinition>(ctx);
                      pVVar11 = storage_1;
                      pTVar1 = ctx->typeVoid;
                      pVVar10 = ExpressionContext::get<VariableHandle>(ctx);
                      VariableHandle::VariableHandle
                                (pVVar10,(SynBase *)0x0,(VariableData *)assignment_1);
                      ExprVariableDefinition::ExprVariableDefinition
                                (pEVar12,(SynBase *)pVVar11,pTVar1,pVVar10,definition_2);
                      pVVar11 = storage_1;
                      result_1 = &pEVar12->super_ExprBase;
                      pEVar4 = CreateVariableAccess
                                         (ctx,(SynBase *)storage_1,(VariableData *)assignment_1,
                                          false);
                      targetClass = (TypeClass *)CreateGetAddress(ctx,(SynBase *)pVVar11,pEVar4);
                      pEVar4 = CreateSequence(ctx,source,result_1,(ExprBase *)targetClass);
                      return pEVar4;
                    }
                  }
                  bVar3 = isType<TypeClass>(valueType_1->subType);
                  if ((bVar3) &&
                     (bVar3 = isType<TypeClass>((TypeBase *)(targetSub->super_TypeStruct).typeScope)
                     , bVar3)) {
                    valueClass = getType<TypeClass>(valueType_1->subType);
                    untyped = (ExprBase *)
                              getType<TypeClass>((TypeBase *)(targetSub->super_TypeStruct).typeScope
                                                );
                    bVar3 = anon_unknown.dwarf_6f1cc::IsDerivedFrom((TypeClass *)untyped,valueClass)
                    ;
                    if (bVar3) {
                      pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                      ExprTypeCast::ExprTypeCast(pEVar7,source,type,value,EXPR_CAST_REINTERPRET);
                      return &pEVar7->super_ExprBase;
                    }
                    bVar3 = anon_unknown.dwarf_6f1cc::IsDerivedFrom(valueClass,(TypeClass *)untyped)
                    ;
                    if (bVar3) {
                      pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                      pTVar9 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
                      ExprTypeCast::ExprTypeCast
                                (pEVar7,source,&pTVar9->super_TypeBase,value,EXPR_CAST_REINTERPRET);
                      typeID = &pEVar7->super_ExprBase;
                      this = ExpressionContext::get<ExprTypeLiteral>(ctx);
                      ExprTypeLiteral::ExprTypeLiteral
                                (this,source,ctx->typeTypeID,(TypeBase *)valueClass);
                      checked = &this->super_ExprBase;
                      InplaceStr::InplaceStr((InplaceStr *)&node_2,"__assert_derived_from");
                      local_130 = CreateFunctionCall2(ctx,source,_node_2,typeID,checked,false,false,
                                                      true);
                      pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                      ExprTypeCast::ExprTypeCast(pEVar7,source,type,local_130,EXPR_CAST_REINTERPRET)
                      ;
                      return &pEVar7->super_ExprBase;
                    }
                  }
                }
              }
              if (((TypeStruct *)type == ctx->typeAutoRef) && (value->type != ctx->typeVoid)) {
                bVar3 = isType<TypeRef>(value->type);
                if (bVar3) {
                  ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeCast>(ctx);
                  ExprTypeCast::ExprTypeCast
                            ((ExprTypeCast *)ctx_local,source,type,value,EXPR_CAST_PTR_TO_AUTO_PTR);
                }
                else {
                  node_4 = (ExprVariableAccess *)0x0;
                  address_2 = &getType<ExprVariableAccess>(value)->super_ExprBase;
                  if ((ExprVariableAccess *)address_2 == (ExprVariableAccess *)0x0) {
                    local_1a0 = getType<ExprDereference>(value);
                    if (local_1a0 == (ExprDereference *)0x0) {
                      pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                      pTVar9 = ExpressionContext::GetReferenceType(ctx,value->type);
                      pEVar4 = CreateCast(ctx,source,value,&pTVar9->super_TypeBase,true);
                      ExprTypeCast::ExprTypeCast
                                (pEVar7,source,type,pEVar4,EXPR_CAST_PTR_TO_AUTO_PTR);
                      node_4 = (ExprVariableAccess *)pEVar7;
                    }
                    else {
                      pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                      ExprTypeCast::ExprTypeCast
                                (pEVar7,source,type,local_1a0->value,EXPR_CAST_PTR_TO_AUTO_PTR);
                      node_4 = (ExprVariableAccess *)pEVar7;
                    }
                  }
                  else {
                    pEVar8 = (ExprDereference *)ExpressionContext::get<ExprGetAddress>(ctx);
                    pTVar9 = ExpressionContext::GetReferenceType(ctx,value->type);
                    pVVar10 = ExpressionContext::get<VariableHandle>(ctx);
                    VariableHandle::VariableHandle
                              (pVVar10,address_2->source,(VariableData *)address_2[1]._vptr_ExprBase
                              );
                    ExprGetAddress::ExprGetAddress
                              ((ExprGetAddress *)pEVar8,source,&pTVar9->super_TypeBase,pVVar10);
                    node_5 = pEVar8;
                    pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                    ExprTypeCast::ExprTypeCast
                              (pEVar7,source,type,&node_5->super_ExprBase,EXPR_CAST_PTR_TO_AUTO_PTR)
                    ;
                    node_4 = (ExprVariableAccess *)pEVar7;
                  }
                  if (isFunctionArgument) {
                    ctx_local = (ExpressionContext *)node_4;
                  }
                  else {
                    InplaceStr::InplaceStr((InplaceStr *)&valueType_2,"duplicate");
                    ctx_local = (ExpressionContext *)
                                CreateFunctionCall1(ctx,source,_valueType_2,&node_4->super_ExprBase,
                                                    false,false,true);
                  }
                }
              }
              else {
                if ((TypeStruct *)type == ctx->typeAutoArray) {
                  bVar3 = isType<TypeUnsizedArray>(value->type);
                  if (bVar3) {
                    pEVar7 = ExpressionContext::get<ExprTypeCast>(ctx);
                    ExprTypeCast::ExprTypeCast
                              (pEVar7,source,type,value,EXPR_CAST_UNSIZED_TO_AUTO_ARRAY);
                    return &pEVar7->super_ExprBase;
                  }
                  pTVar13 = getType<TypeArray>(value->type);
                  if (pTVar13 != (TypeArray *)0x0) {
                    pTVar6 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar13->subType);
                    pEVar4 = CreateCast(ctx,source,value,(TypeBase *)pTVar6,false);
                    pEVar4 = CreateCast(ctx,source,pEVar4,type,false);
                    return pEVar4;
                  }
                }
                if ((((TypeStruct *)value->type != ctx->typeAutoRef) ||
                    (bVar3 = isType<TypeRef>(type), bVar3)) || (type == ctx->typeVoid)) {
                  ctx_local = (ExpressionContext *)
                              anon_unknown.dwarf_6f1cc::ReportExpected
                                        (ctx,source,type,
                                         "ERROR: cannot convert \'%.*s\' to \'%.*s\'",
                                         (ulong)(uint)((int)(value->type->name).end -
                                                      (int)(value->type->name).begin),
                                         (value->type->name).begin,
                                         CONCAT44(uVar15,(int)(type->name).end -
                                                         (int)(type->name).begin),(type->name).begin
                                        );
                }
                else {
                  pTVar9 = ExpressionContext::GetReferenceType(ctx,type);
                  pEVar4 = CreateCast(ctx,source,value,&pTVar9->super_TypeBase,false);
                  ctx_local = (ExpressionContext *)ExpressionContext::get<ExprDereference>(ctx);
                  ExprDereference::ExprDereference((ExprDereference *)ctx_local,source,type,pEVar4);
                }
              }
            }
            else {
              address = &getType<ExprVariableAccess>(value)->super_ExprBase;
              if ((ExprVariableAccess *)address == (ExprVariableAccess *)0x0) {
                sourceInternal = (SynBase *)getType<ExprDereference>(value);
                if (sourceInternal == (SynBase *)0x0) {
                  pVVar11 = (VariableData *)ExpressionContext::MakeInternal(ctx,source);
                  storage = pVVar11;
                  pTVar9 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)node);
                  alloc = (ExprBase *)
                          anon_unknown.dwarf_6f1cc::AllocateTemporary
                                    (ctx,(SynBase *)pVVar11,&pTVar9->super_TypeBase);
                  definition_1 = CreateObjectAllocation(ctx,(SynBase *)storage,(TypeBase *)node);
                  pEVar12 = ExpressionContext::get<ExprVariableDefinition>(ctx);
                  pVVar11 = storage;
                  pTVar1 = ctx->typeVoid;
                  pVVar10 = ExpressionContext::get<VariableHandle>(ctx);
                  VariableHandle::VariableHandle(pVVar10,(SynBase *)0x0,(VariableData *)alloc);
                  pVVar2 = storage;
                  pEVar4 = CreateVariableAccess(ctx,(SynBase *)storage,(VariableData *)alloc,false);
                  pEVar4 = CreateAssignment(ctx,(SynBase *)pVVar2,pEVar4,definition_1);
                  ExprVariableDefinition::ExprVariableDefinition
                            (pEVar12,(SynBase *)pVVar11,pTVar1,pVVar10,pEVar4);
                  pVVar11 = storage;
                  assignment = &pEVar12->super_ExprBase;
                  pEVar8 = ExpressionContext::get<ExprDereference>(ctx);
                  type_00 = node;
                  pVVar2 = storage;
                  pEVar4 = CreateVariableAccess(ctx,(SynBase *)storage,(VariableData *)alloc,false);
                  ExprDereference::ExprDereference
                            (pEVar8,(SynBase *)pVVar2,(TypeBase *)type_00,pEVar4);
                  result = CreateAssignment(ctx,(SynBase *)pVVar11,&pEVar8->super_ExprBase,value);
                  pTVar9 = (TypeRef *)ExpressionContext::get<ExprTypeCast>(ctx);
                  pVVar11 = storage;
                  pEVar4 = CreateVariableAccess(ctx,(SynBase *)storage,(VariableData *)alloc,false);
                  ExprTypeCast::ExprTypeCast
                            ((ExprTypeCast *)pTVar9,(SynBase *)pVVar11,type,pEVar4,
                             EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
                  target_2 = pTVar9;
                  ctx_local = (ExpressionContext *)
                              CreateSequence(ctx,source,assignment,result,(ExprBase *)pTVar9);
                }
                else {
                  ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeCast>(ctx);
                  ExprTypeCast::ExprTypeCast
                            ((ExprTypeCast *)ctx_local,source,type,(ExprBase *)sourceInternal->next,
                             EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
                }
              }
              else {
                pEVar8 = (ExprDereference *)ExpressionContext::get<ExprGetAddress>(ctx);
                pTVar9 = ExpressionContext::GetReferenceType(ctx,value->type);
                pVVar10 = ExpressionContext::get<VariableHandle>(ctx);
                VariableHandle::VariableHandle
                          (pVVar10,address->source,(VariableData *)address[1]._vptr_ExprBase);
                ExprGetAddress::ExprGetAddress
                          ((ExprGetAddress *)pEVar8,source,&pTVar9->super_TypeBase,pVVar10);
                node_1 = pEVar8;
                ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeCast>(ctx);
                ExprTypeCast::ExprTypeCast
                          ((ExprTypeCast *)ctx_local,source,type,&node_1->super_ExprBase,
                           EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
              }
            }
          }
        }
        else {
          ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeCast>(ctx);
          ExprTypeCast::ExprTypeCast
                    ((ExprTypeCast *)ctx_local,source,type,value,EXPR_CAST_REINTERPRET);
        }
      }
    }
    else {
      pEVar4 = CreateFunctionPointer(ctx,source,definition_00,true);
      ctx_local = (ExpressionContext *)CreateCast(ctx,source,pEVar4,type,isFunctionArgument);
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateCast(ExpressionContext &ctx, SynBase *source, ExprBase *value, TypeBase *type, bool isFunctionArgument)
{
	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

	// When function is used as value, hide its visibility immediately after use
	if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(value))
		return CreateCast(ctx, source, CreateFunctionPointer(ctx, source, definition, true), type, isFunctionArgument);

	if(value->type == type)
	{
		AssertValueExpression(ctx, source, value);

		return value;
	}

	if(TypeFunction *target = getType<TypeFunction>(type))
	{
		if(FunctionValue function = GetFunctionForType(ctx, source, value, target))
		{
			if(isType<TypeAutoRef>(function.context->type))
				Stop(ctx, source, "ERROR: can't convert dynamic function set to '%.*s'", FMT_ISTR(type->name));

			ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(function.source, type, function.function, function.context);

			if(isType<ExprFunctionDefinition>(value) || isType<ExprGenericFunctionPrototype>(value))
				return CreateSequence(ctx, source, value, access);

			return access;
		}

		if(value->type->isGeneric)
			Stop(ctx, source, "ERROR: can't resolve generic type '%.*s' instance for '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(type->name));
	}

	if(!AssertValueExpression(ctx, source, value))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

	if(ctx.IsNumericType(value->type) && ctx.IsNumericType(type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NUMERICAL);

	if(type == ctx.typeBool)
	{
		if(isType<TypeRef>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_PTR_TO_BOOL);

		if(isType<TypeUnsizedArray>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_UNSIZED_TO_BOOL);

		if(isType<TypeFunction>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_FUNCTION_TO_BOOL);
	}

	if(value->type == ctx.typeNullPtr)
	{
		// nullptr to type ref conversion
		if(isType<TypeRef>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_PTR);

		// nullptr to auto ref conversion
		if(type == ctx.typeAutoRef)
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_AUTO_PTR);

		// nullptr to type[] conversion
		if(isType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_UNSIZED);

		// nullptr to auto[] conversion
		if(type == ctx.typeAutoArray)
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_AUTO_ARRAY);

		// nullptr to function type conversion
		if(isType<TypeFunction>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_FUNCTION);
	}

	if(TypeUnsizedArray *target = getType<TypeUnsizedArray>(type))
	{
		// type[N] to type[] conversion
		if(TypeArray *valueType = getType<TypeArray>(value->type))
		{
			if(target->subType == valueType->subType)
			{
				if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
				{
					ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, address, EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
				}
				else if(ExprDereference *node = getType<ExprDereference>(value))
				{
					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, node->value, EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
				}

				// Allocate storage in heap and copy literal data into it
				SynBase *sourceInternal = ctx.MakeInternal(source);

				VariableData *storage = AllocateTemporary(ctx, sourceInternal, ctx.GetReferenceType(valueType));

				ExprBase *alloc = CreateObjectAllocation(ctx, sourceInternal, valueType);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), alloc));

				ExprBase *assignment = CreateAssignment(ctx, sourceInternal, new (ctx.get<ExprDereference>()) ExprDereference(sourceInternal, valueType, CreateVariableAccess(ctx, sourceInternal, storage, false)), value);

				ExprBase *result = new (ctx.get<ExprTypeCast>()) ExprTypeCast(sourceInternal, type, CreateVariableAccess(ctx, sourceInternal, storage, false), EXPR_CAST_ARRAY_PTR_TO_UNSIZED);

				return CreateSequence(ctx, source, definition, assignment, result);
			}
		}
	}

	if(TypeRef *target = getType<TypeRef>(type))
	{
		if(TypeRef *valueType = getType<TypeRef>(value->type))
		{
			// type[N] ref to type[] ref conversion
			if(isType<TypeUnsizedArray>(target->subType) && isType<TypeArray>(valueType->subType))
			{
				TypeUnsizedArray *targetSub = getType<TypeUnsizedArray>(target->subType);
				TypeArray *sourceSub = getType<TypeArray>(valueType->subType);

				if(targetSub->subType == sourceSub->subType)
				{
					SynBase *sourceInternal = ctx.MakeInternal(source);

					VariableData *storage = AllocateTemporary(ctx, sourceInternal, targetSub);

					ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), new (ctx.get<ExprTypeCast>()) ExprTypeCast(sourceInternal, targetSub, value, EXPR_CAST_ARRAY_PTR_TO_UNSIZED));

					ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

					ExprBase *result = CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false));

					return CreateSequence(ctx, source, definition, result);
				}
			}

			if(isType<TypeClass>(target->subType) && isType<TypeClass>(valueType->subType))
			{
				TypeClass *targetClass = getType<TypeClass>(target->subType);
				TypeClass *valueClass = getType<TypeClass>(valueType->subType);

				if(IsDerivedFrom(valueClass, targetClass))
					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

				if(IsDerivedFrom(targetClass, valueClass))
				{
					ExprBase *untyped = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetReferenceType(ctx.typeVoid), value, EXPR_CAST_REINTERPRET);
					ExprBase *typeID = new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, targetClass);

					ExprBase *checked = CreateFunctionCall2(ctx, source, InplaceStr("__assert_derived_from"), untyped, typeID, false, false, true);

					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, checked, EXPR_CAST_REINTERPRET);
				}
			}
		}
		else if(value->type == ctx.typeAutoRef)
		{
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_AUTO_PTR_TO_PTR);
		}
		else if(isFunctionArgument && value->type == target->subType)
		{
			// type to type ref conversion
			if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
			{
				ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

				return address;
			}
			else if(ExprDereference *node = getType<ExprDereference>(value))
			{
				return node->value;
			}
			else if(target->subType == value->type)
			{
				SynBase *sourceInternal = ctx.MakeInternal(source);

				VariableData *storage = AllocateTemporary(ctx, sourceInternal, target->subType);

				ExprBase *assignment = new (ctx.get<ExprAssignment>()) ExprAssignment(sourceInternal, storage->type, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)), value);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

				ExprBase *result = CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false));

				return CreateSequence(ctx, source, definition, result);
			}
		}
	}

	if(type == ctx.typeAutoRef && value->type != ctx.typeVoid)
	{
		// type ref to auto ref conversion
		if(isType<TypeRef>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_PTR_TO_AUTO_PTR);

		ExprTypeCast *typeCast = NULL;

		// type to auto ref conversion
		if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
		{
			ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, address, EXPR_CAST_PTR_TO_AUTO_PTR);
		}
		else if(ExprDereference *node = getType<ExprDereference>(value))
		{
			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, node->value, EXPR_CAST_PTR_TO_AUTO_PTR);
		}
		else
		{
			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, CreateCast(ctx, source, value, ctx.GetReferenceType(value->type), true), EXPR_CAST_PTR_TO_AUTO_PTR);
		}

		if(isFunctionArgument)
			return typeCast;

		// type to auto ref conversion (boxing)
		return CreateFunctionCall1(ctx, source, InplaceStr("duplicate"), typeCast, false, false, true);
	}

	if(type == ctx.typeAutoArray)
	{
		// type[] to auto[] conversion
		if(isType<TypeUnsizedArray>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_UNSIZED_TO_AUTO_ARRAY);
		
		if(TypeArray *valueType = getType<TypeArray>(value->type))
		{
			ExprBase *unsized = CreateCast(ctx, source, value, ctx.GetUnsizedArrayType(valueType->subType), false);

			return CreateCast(ctx, source, unsized, type, false);
		}
	}

	if(value->type == ctx.typeAutoRef)
	{
		// auto ref to type (unboxing)
		if(!isType<TypeRef>(type) && type != ctx.typeVoid)
		{
			ExprBase *ptr = CreateCast(ctx, source, value, ctx.GetReferenceType(type), false);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type, ptr);
		}
	}

	return ReportExpected(ctx, source, type, "ERROR: cannot convert '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(type->name));
}